

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v9::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  size_t sVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  
  compare(this,other);
  uVar4 = other->exp_ - this->exp_;
  puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
  sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
  puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar5 = 0;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    uVar7 = uVar4 + sVar6 & 0xffffffff;
    lVar8 = (ulong)puVar3[uVar7] - ((ulong)uVar5 + (ulong)puVar1[sVar6]);
    puVar3[uVar7] = (uint)lVar8;
    uVar5 = (uint)((ulong)lVar8 >> 0x3f);
  }
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar4 = uVar4 + (int)sVar6;
  while (uVar5 != 0) {
    lVar8 = (ulong)puVar1[uVar4] - (ulong)uVar5;
    puVar1[uVar4] = (uint)lVar8;
    uVar5 = (uint)((ulong)lVar8 >> 0x3f);
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }